

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

double __thiscall llvm::APInt::roundToDouble(APInt *this,bool isSigned)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint64_t uVar5;
  int64_t iVar6;
  ulong uVar7;
  double dVar8;
  undefined1 auVar9 [16];
  bool local_a1;
  anon_union_8_2_9472fc66 T;
  uint64_t sign;
  uint64_t lobits;
  uint64_t hibits;
  ulong uStack_70;
  uint hiWord;
  uint64_t mantissa;
  uint64_t exp;
  uint n;
  anon_union_8_2_1313ab2f_for_U local_40;
  APInt Tmp;
  bool isNeg;
  int64_t sext;
  bool isSigned_local;
  APInt *this_local;
  
  bVar2 = isSingleWord(this);
  if ((bVar2) || (uVar3 = getActiveBits(this), uVar3 < 0x41)) {
    if (isSigned) {
      uVar5 = getWord(this,0);
      iVar6 = SignExtend64(uVar5,this->BitWidth);
      this_local = (APInt *)(double)iVar6;
    }
    else {
      uVar5 = getWord(this,0);
      auVar9._8_4_ = (int)(uVar5 >> 0x20);
      auVar9._0_8_ = uVar5;
      auVar9._12_4_ = 0x45300000;
      this_local = (APInt *)((auVar9._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0));
    }
  }
  else {
    if (isSigned) {
      local_a1 = operator[](this,this->BitWidth - 1);
    }
    else {
      local_a1 = false;
    }
    Tmp._15_1_ = local_a1;
    if (local_a1 == false) {
      APInt((APInt *)&local_40,this);
    }
    else {
      APInt((APInt *)&n,this);
      llvm::operator-((llvm *)&local_40,(APInt *)&n);
      ~APInt((APInt *)&n);
    }
    uVar3 = getActiveBits((APInt *)&local_40);
    if ((ulong)uVar3 < 0x400) {
      uVar4 = whichWord(uVar3 - 1);
      bVar1 = (byte)uVar3;
      if (uVar4 == 0) {
        uStack_70 = *local_40.pVal;
        if (0x34 < uVar3) {
          uStack_70 = uStack_70 >> (bVar1 - 0x34 & 0x3f);
        }
      }
      else {
        if (uVar4 == 0) {
          __assert_fail("hiWord > 0 && \"huh?\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                        ,800,"double llvm::APInt::roundToDouble(bool) const");
        }
        uStack_70 = local_40.pVal[uVar4] << (0x34 - (bVar1 & 0x3f) & 0x3f) |
                    local_40.pVal[uVar4 - 1] >> ((bVar1 & 0x3f) + 0xb & 0x3f);
      }
      uVar7 = 0;
      if ((Tmp._15_1_ & 1) != 0) {
        uVar7 = 0x8000000000000000;
      }
      this_local = (APInt *)(uVar7 | (ulong)uVar3 + 0x3ff << 0x34 | uStack_70);
    }
    else if ((isSigned) && ((Tmp._15_1_ & 1) != 0)) {
      dVar8 = std::numeric_limits<double>::infinity();
      this_local = (APInt *)((ulong)dVar8 ^ 0x8000000000000000);
    }
    else {
      this_local = (APInt *)std::numeric_limits<double>::infinity();
    }
    ~APInt((APInt *)&local_40);
  }
  return (double)this_local;
}

Assistant:

double APInt::roundToDouble(bool isSigned) const {

  // Handle the simple case where the value is contained in one uint64_t.
  // It is wrong to optimize getWord(0) to VAL; there might be more than one word.
  if (isSingleWord() || getActiveBits() <= APINT_BITS_PER_WORD) {
    if (isSigned) {
      int64_t sext = SignExtend64(getWord(0), BitWidth);
      return double(sext);
    } else
      return double(getWord(0));
  }

  // Determine if the value is negative.
  bool isNeg = isSigned ? (*this)[BitWidth-1] : false;

  // Construct the absolute value if we're negative.
  APInt Tmp(isNeg ? -(*this) : (*this));

  // Figure out how many bits we're using.
  unsigned n = Tmp.getActiveBits();

  // The exponent (without bias normalization) is just the number of bits
  // we are using. Note that the sign bit is gone since we constructed the
  // absolute value.
  uint64_t exp = n;

  // Return infinity for exponent overflow
  if (exp > 1023) {
    if (!isSigned || !isNeg)
      return std::numeric_limits<double>::infinity();
    else
      return -std::numeric_limits<double>::infinity();
  }
  exp += 1023; // Increment for 1023 bias

  // Number of bits in mantissa is 52. To obtain the mantissa value, we must
  // extract the high 52 bits from the correct words in pVal.
  uint64_t mantissa;
  unsigned hiWord = whichWord(n-1);
  if (hiWord == 0) {
    mantissa = Tmp.U.pVal[0];
    if (n > 52)
      mantissa >>= n - 52; // shift down, we want the top 52 bits.
  } else {
    assert(hiWord > 0 && "huh?");
    uint64_t hibits = Tmp.U.pVal[hiWord] << (52 - n % APINT_BITS_PER_WORD);
    uint64_t lobits = Tmp.U.pVal[hiWord-1] >> (11 + n % APINT_BITS_PER_WORD);
    mantissa = hibits | lobits;
  }

  // The leading bit of mantissa is implicit, so get rid of it.
  uint64_t sign = isNeg ? (1ULL << (APINT_BITS_PER_WORD - 1)) : 0;
  union {
    double D;
    uint64_t I;
  } T;
  T.I = sign | (exp << 52) | mantissa;
  return T.D;
}